

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDefaultCollisionConfiguration.cpp
# Opt level: O2

btCollisionAlgorithmCreateFunc * __thiscall
btDefaultCollisionConfiguration::getCollisionAlgorithmCreateFunc
          (btDefaultCollisionConfiguration *this,int proxyType0,int proxyType1)

{
  long lStack_8;
  
  if ((proxyType0 ^ 8U) == 0 && (proxyType1 ^ 8U) == 0) {
    lStack_8 = 0x78;
  }
  else {
    lStack_8 = 0x98;
    if (((proxyType0 ^ 8U) != 0 || proxyType1 != 1) &&
       (lStack_8 = 0xa0, proxyType0 != 1 || (proxyType1 ^ 8U) != 0)) {
      if (proxyType1 == 0 && proxyType0 == 0) {
        lStack_8 = 0x90;
      }
      else {
        lStack_8 = 0xb0;
        if ((0x13 < proxyType0 || proxyType1 != 0x1c) &&
           (lStack_8 = 0xa8, proxyType0 != 0x1c || 0x13 < proxyType1)) {
          if (proxyType0 < 0x14) {
            if (proxyType1 < 0x14) {
              lStack_8 = 0x40;
              goto LAB_001467df;
            }
            if (proxyType1 - 0x15U < 9) {
              lStack_8 = 0x48;
              goto LAB_001467df;
            }
          }
          else {
            if (proxyType1 < 0x14 && proxyType0 - 0x15U < 9) {
              lStack_8 = 0x50;
              goto LAB_001467df;
            }
            if (proxyType0 == 0x1f) {
              lStack_8 = (ulong)(proxyType1 == 0x1f) * 8 + 0x58;
              goto LAB_001467df;
            }
          }
          lStack_8 = (ulong)(proxyType1 != 0x1f) * 8 + 0x68;
        }
      }
    }
  }
LAB_001467df:
  return *(btCollisionAlgorithmCreateFunc **)
          ((long)&(this->super_btCollisionConfiguration)._vptr_btCollisionConfiguration + lStack_8);
}

Assistant:

btCollisionAlgorithmCreateFunc* btDefaultCollisionConfiguration::getCollisionAlgorithmCreateFunc(int proxyType0,int proxyType1)
{



	if ((proxyType0 == SPHERE_SHAPE_PROXYTYPE) && (proxyType1==SPHERE_SHAPE_PROXYTYPE))
	{
		return	m_sphereSphereCF;
	}
#ifdef USE_BUGGY_SPHERE_BOX_ALGORITHM
	if ((proxyType0 == SPHERE_SHAPE_PROXYTYPE) && (proxyType1==BOX_SHAPE_PROXYTYPE))
	{
		return	m_sphereBoxCF;
	}

	if ((proxyType0 == BOX_SHAPE_PROXYTYPE ) && (proxyType1==SPHERE_SHAPE_PROXYTYPE))
	{
		return	m_boxSphereCF;
	}
#endif //USE_BUGGY_SPHERE_BOX_ALGORITHM


	if ((proxyType0 == SPHERE_SHAPE_PROXYTYPE ) && (proxyType1==TRIANGLE_SHAPE_PROXYTYPE))
	{
		return	m_sphereTriangleCF;
	}

	if ((proxyType0 == TRIANGLE_SHAPE_PROXYTYPE  ) && (proxyType1==SPHERE_SHAPE_PROXYTYPE))
	{
		return	m_triangleSphereCF;
	} 

	if ((proxyType0 == BOX_SHAPE_PROXYTYPE) && (proxyType1 == BOX_SHAPE_PROXYTYPE))
	{
		return m_boxBoxCF;
	}
	
	if (btBroadphaseProxy::isConvex(proxyType0) && (proxyType1 == STATIC_PLANE_PROXYTYPE))
	{
		return m_convexPlaneCF;
	}

	if (btBroadphaseProxy::isConvex(proxyType1) && (proxyType0 == STATIC_PLANE_PROXYTYPE))
	{
		return m_planeConvexCF;
	}
	


	if (btBroadphaseProxy::isConvex(proxyType0) && btBroadphaseProxy::isConvex(proxyType1))
	{
		return m_convexConvexCreateFunc;
	}

	if (btBroadphaseProxy::isConvex(proxyType0) && btBroadphaseProxy::isConcave(proxyType1))
	{
		return m_convexConcaveCreateFunc;
	}

	if (btBroadphaseProxy::isConvex(proxyType1) && btBroadphaseProxy::isConcave(proxyType0))
	{
		return m_swappedConvexConcaveCreateFunc;
	}


	if (btBroadphaseProxy::isCompound(proxyType0) && btBroadphaseProxy::isCompound(proxyType1))
	{
		return m_compoundCompoundCreateFunc;
	}

	if (btBroadphaseProxy::isCompound(proxyType0))
	{
		return m_compoundCreateFunc;
	} else
	{
		if (btBroadphaseProxy::isCompound(proxyType1))
		{
			return m_swappedCompoundCreateFunc;
		}
	}

	//failed to find an algorithm
	return m_emptyCreateFunc;
}